

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.h
# Opt level: O2

void __thiscall refc<cg_other>::decrement(refc<cg_other> *this)

{
  int *piVar1;
  _Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_> *this_00;
  
  piVar1 = this->count;
  if (*piVar1 == 1) {
    operator_delete(piVar1);
    this_00 = (_Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_> *)this->ptr;
    if (this_00 != (_Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_> *)0x0) {
      std::_Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>::~_Vector_base
                (this_00);
    }
    operator_delete(this_00);
    return;
  }
  *piVar1 = *piVar1 + -1;
  return;
}

Assistant:

void decrement() {
        if (*count == 1) {
            delete count;
            delete ptr;
        } else {
            --*count;
        }
    }